

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void __thiscall
cubeb_resampler_passthrough_output_only_Test::TestBody
          (cubeb_resampler_passthrough_output_only_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  uint32_t i;
  long got;
  float output_buffer [512];
  cubeb_resampler *resampler;
  int target_rate;
  size_t output_channels;
  cubeb_stream_params output_params;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffff77c;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffff784;
  undefined4 in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff78c;
  uint uVar4;
  AssertHelper in_stack_fffffffffffff790;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff798;
  uint in_stack_fffffffffffff7a4;
  cubeb_stream_params *in_stack_fffffffffffff7a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b8;
  undefined4 in_stack_fffffffffffff7bc;
  uint uVar5;
  cubeb_resampler_quality in_stack_fffffffffffff7d0;
  cubeb_resampler_reclock in_stack_fffffffffffff7d8;
  
  uVar2 = 0;
  uVar3 = 0;
  cubeb_resampler_create
            ((cubeb_stream *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
             (cubeb_stream_params *)in_stack_fffffffffffff7b0.ptr_,in_stack_fffffffffffff7a8,
             in_stack_fffffffffffff7a4,(cubeb_data_callback)in_stack_fffffffffffff798.ptr_,
             in_stack_fffffffffffff790.data_,in_stack_fffffffffffff7d0,in_stack_fffffffffffff7d8);
  uVar5 = 0;
  while( true ) {
    if (0x1d < uVar5) {
      cubeb_resampler_destroy((cubeb_resampler *)CONCAT44(in_stack_fffffffffffff784,uVar3));
      return;
    }
    cubeb_resampler_fill
              ((cubeb_resampler *)in_stack_fffffffffffff790.data_,
               (void *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
               (long *)CONCAT44(in_stack_fffffffffffff784,uVar3),
               (void *)CONCAT44(in_stack_fffffffffffff77c,uVar2),0x10aeeb);
    testing::internal::EqHelper<false>::Compare<long,int>
              ((char *)in_stack_fffffffffffff798.ptr_,(char *)in_stack_fffffffffffff790.data_,
               (long *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
               (int *)CONCAT44(in_stack_fffffffffffff784,uVar3));
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffff7a8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff790.data_);
      message = testing::AssertionResult::failure_message((AssertionResult *)0x10af40);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffff790,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,0x249,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffff790,(Message *)&stack0xfffffffffffff798);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff790);
      testing::Message::~Message((Message *)0x10af81);
    }
    uVar4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10af9d);
    if (uVar4 != 0) break;
    uVar5 = uVar5 + 1;
    in_stack_fffffffffffff78c = 0;
  }
  return;
}

Assistant:

TEST(cubeb, resampler_passthrough_output_only)
{
  // Test that the passthrough resampler works when there is only an output stream.
  cubeb_stream_params output_params;

  const size_t output_channels = 2;
  output_params.channels = output_channels;
  output_params.rate = 44100;
  output_params.format = CUBEB_SAMPLE_FLOAT32NE;
  int target_rate = output_params.rate;

  cubeb_resampler * resampler =
    cubeb_resampler_create((cubeb_stream*)nullptr, nullptr, &output_params,
                           target_rate, cb_passthrough_resampler_output, nullptr,
                           CUBEB_RESAMPLER_QUALITY_VOIP,
                           CUBEB_RESAMPLER_RECLOCK_NONE);

  float output_buffer[output_channels * 256];

  long got;
  for (uint32_t i = 0; i < 30; i++) {
    got = cubeb_resampler_fill(resampler, nullptr, nullptr, output_buffer, 256);
    ASSERT_EQ(got, 256);
  }

  cubeb_resampler_destroy(resampler);
}